

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

CheckerInstanceSymbol *
slang::ast::CheckerInstanceSymbol::createInvalid(CheckerSymbol *checker,uint32_t depth)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  Scope *pSVar3;
  ulong uVar4;
  SyntaxNode *pSVar5;
  SyntaxNode *pSVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  SyntaxNode *pSVar9;
  ulong uVar10;
  int iVar11;
  AssertionInstanceDetails *args_2;
  CheckerInstanceBodySymbol *args_2_00;
  CheckerInstanceSymbol *pCVar12;
  undefined4 extraout_var;
  ulong pos0;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  uint uVar13;
  Compilation *this;
  ulong uVar14;
  ulong hash;
  pointer ppAVar15;
  long lVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  LookupLocation LVar22;
  try_emplace_args_t local_1d1;
  AssertionInstanceDetails *local_1d0;
  Symbol *actualArg;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
  *local_1c0;
  CheckerInstanceBodySymbol *local_1b8;
  SourceLocation *local_1b0;
  CheckerSymbol *local_1a8;
  SyntaxNode *local_1a0;
  ulong local_198;
  pointer local_190;
  ExpressionSyntax *outputInitialSyntax;
  uint32_t depth_local;
  undefined1 local_178 [16];
  bitmask<slang::ast::ASTFlags> local_168;
  Symbol *pSStack_160;
  TempVarSymbol *local_158;
  RandomizeDetails *pRStack_150;
  AssertionInstanceDetails *local_148;
  _Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false> local_140;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  byte bStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  byte bStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  byte bStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  byte bStack_129;
  undefined1 local_128 [24];
  Symbol *pSStack_110;
  undefined1 local_108 [16];
  AssertionInstanceDetails *local_f8;
  locator local_f0;
  SmallVector<slang::ast::CheckerInstanceSymbol::Connection,_2UL> connections;
  
  pSVar3 = (checker->super_Symbol).parentScope;
  this = pSVar3->compilation;
  depth_local = depth;
  args_2 = Compilation::allocAssertionDetails(this);
  args_2->symbol = &checker->super_Symbol;
  local_1b0 = &(checker->super_Symbol).location;
  args_2->instanceLoc = (checker->super_Symbol).location;
  LVar22 = LookupLocation::after(&checker->super_Symbol);
  local_128._8_4_ = LVar22.index;
  stack0xfffffffffffffee8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = (AssertionInstanceDetails *)0x0;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ =
       (pointer)((ulong)connections.
                        super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ &
                0xffffffffffffff00);
  local_178[0] = 1;
  local_128._0_8_ = pSVar3;
  args_2_00 = BumpAllocator::
              emplace<slang::ast::CheckerInstanceBodySymbol,slang::ast::Compilation&,slang::ast::CheckerSymbol_const&,slang::ast::AssertionInstanceDetails&,slang::ast::ASTContext&,unsigned_int&,bool,slang::ast::InstanceFlags>
                        (&this->super_BumpAllocator,this,checker,args_2,(ASTContext *)local_128,
                         &depth_local,(bool *)&connections,local_178);
  local_1a0 = (checker->super_Symbol).originatingSyntax;
  (args_2_00->super_Symbol).originatingSyntax = local_1a0;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.data_ =
       (pointer)connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.
                firstElement;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.len = 0;
  connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>.cap = 2;
  ppAVar15 = (checker->ports)._M_ptr;
  local_190 = ppAVar15 + (checker->ports)._M_extent._M_extent_value;
  local_1c0 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
               *)&args_2->argumentMap;
  local_1d0 = args_2;
  local_1b8 = args_2_00;
  local_1a8 = checker;
  do {
    pSVar9 = local_1a0;
    if (ppAVar15 == local_190) {
      pSVar5 = local_1a0[7].parent;
      pSVar6 = local_1a0[7].previewNode;
      local_1b8 = (CheckerInstanceBodySymbol *)&local_1b8->super_Scope;
      for (lVar16 = 0; (long)pSVar6 << 3 != lVar16; lVar16 = lVar16 + 8) {
        Scope::addMembers((Scope *)local_1b8,*(SyntaxNode **)((long)&pSVar5->kind + lVar16));
      }
      pCVar12 = BumpAllocator::
                emplace<slang::ast::CheckerInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::CheckerInstanceBodySymbol&>
                          (&this->super_BumpAllocator,&(local_1a8->super_Symbol).name,local_1b0,
                           args_2_00);
      (pCVar12->super_InstanceSymbolBase).super_Symbol.originatingSyntax = pSVar9;
      iVar11 = SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::copy
                         (&connections.
                           super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>,
                          (EVP_PKEY_CTX *)this,src);
      (pCVar12->connections)._M_ptr = (pointer)CONCAT44(extraout_var,iVar11);
      (pCVar12->connections)._M_extent._M_extent_value = extraout_RDX;
      SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::cleanup
                (&connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>,
                 (EVP_PKEY_CTX *)this);
      return pCVar12;
    }
    if (((*ppAVar15)->super_Symbol).name._M_len != 0) {
      outputInitialSyntax = (ExpressionSyntax *)0x0;
      actualArg = createCheckerFormal(this,*ppAVar15,args_2_00,&outputInitialSyntax,
                                      (ASTContext *)local_128);
      local_148 = local_f8;
      local_178._12_4_ = local_128._12_4_;
      local_178._8_4_ = local_128._8_4_;
      local_158 = (TempVarSymbol *)local_108._0_8_;
      pRStack_150 = (RandomizeDetails *)local_108._8_8_;
      local_168.m_bits = local_128._16_8_;
      pSStack_160 = pSStack_110;
      local_178._0_8_ = local_128._0_8_;
      local_140._M_head_impl = (PropertyExprSyntax *)0x0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = actualArg;
      hash = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
      pos0 = hash >> ((byte)(local_1d0->argumentMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                            .arrays.groups_size_index & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[hash & 0xff];
      uVar14 = pos0;
      uVar10 = 0;
      do {
        local_198 = uVar10;
        pgVar1 = (local_1d0->argumentMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .arrays.groups_ + uVar14;
        local_138 = pgVar1->m[0].n;
        uStack_137 = pgVar1->m[1].n;
        uStack_136 = pgVar1->m[2].n;
        bStack_135 = pgVar1->m[3].n;
        uStack_134 = pgVar1->m[4].n;
        uStack_133 = pgVar1->m[5].n;
        uStack_132 = pgVar1->m[6].n;
        bStack_131 = pgVar1->m[7].n;
        uStack_130 = pgVar1->m[8].n;
        uStack_12f = pgVar1->m[9].n;
        uStack_12e = pgVar1->m[10].n;
        bStack_12d = pgVar1->m[0xb].n;
        uStack_12c = pgVar1->m[0xc].n;
        uStack_12b = pgVar1->m[0xd].n;
        uStack_12a = pgVar1->m[0xe].n;
        bStack_129 = pgVar1->m[0xf].n;
        uVar17 = (uchar)uVar2;
        auVar21[0] = -(local_138 == uVar17);
        uVar18 = (uchar)((uint)uVar2 >> 8);
        auVar21[1] = -(uStack_137 == uVar18);
        uVar19 = (uchar)((uint)uVar2 >> 0x10);
        auVar21[2] = -(uStack_136 == uVar19);
        bVar20 = (byte)((uint)uVar2 >> 0x18);
        auVar21[3] = -(bStack_135 == bVar20);
        auVar21[4] = -(uStack_134 == uVar17);
        auVar21[5] = -(uStack_133 == uVar18);
        auVar21[6] = -(uStack_132 == uVar19);
        auVar21[7] = -(bStack_131 == bVar20);
        auVar21[8] = -(uStack_130 == uVar17);
        auVar21[9] = -(uStack_12f == uVar18);
        auVar21[10] = -(uStack_12e == uVar19);
        auVar21[0xb] = -(bStack_12d == bVar20);
        auVar21[0xc] = -(uStack_12c == uVar17);
        auVar21[0xd] = -(uStack_12b == uVar18);
        auVar21[0xe] = -(uStack_12a == uVar19);
        auVar21[0xf] = -(bStack_129 == bVar20);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          do {
            uVar7 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            if (actualArg ==
                (local_1d0->argumentMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.elements_[uVar14 * 0xf + (ulong)uVar7].first) goto LAB_001d0269;
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_129) == 0) break;
        uVar4 = (local_1d0->argumentMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                .arrays.groups_size_mask;
        uVar14 = uVar14 + local_198 + 1 & uVar4;
        uVar10 = local_198 + 1;
      } while (local_198 + 1 <= uVar4);
      if ((local_1d0->argumentMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
          .size_ctrl.size <
          (local_1d0->argumentMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                  (&local_f0,local_1c0,pos0,hash,&local_1d1,&actualArg,
                   (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   local_178);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
                  (&local_f0,local_1c0,hash,&local_1d1,&actualArg,
                   (tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *)
                   local_178);
      }
LAB_001d0269:
      local_178._0_8_ = (pointer)0x0;
      local_178._8_8_ = 0;
      SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::
      emplace_back<slang::ast::CheckerInstanceBodySymbol&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax_const*&,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>
                (&connections.super_SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>,
                 args_2_00,actualArg,&outputInitialSyntax,
                 (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)local_178
                );
    }
    ppAVar15 = ppAVar15 + 1;
  } while( true );
}

Assistant:

CheckerInstanceSymbol& CheckerInstanceSymbol::createInvalid(const CheckerSymbol& checker,
                                                            uint32_t depth) {
    auto scope = checker.getParentScope();
    SLANG_ASSERT(scope);

    auto& comp = scope->getCompilation();
    auto assertionDetails = comp.allocAssertionDetails();
    assertionDetails->symbol = &checker;
    assertionDetails->instanceLoc = checker.location;

    ASTContext context(*scope, LookupLocation::after(checker));
    auto body = comp.emplace<CheckerInstanceBodySymbol>(comp, checker, *assertionDetails, context,
                                                        depth,
                                                        /* isProcedural */ false,
                                                        InstanceFlags::Uninstantiated);

    auto checkerSyntax = checker.getSyntax();
    SLANG_ASSERT(checkerSyntax);
    body->setSyntax(*checkerSyntax);

    SmallVector<Connection> connections;
    for (auto port : checker.ports) {
        if (port->name.empty())
            continue;

        const ExpressionSyntax* outputInitialSyntax = nullptr;
        auto actualArg = createCheckerFormal(comp, *port, *body, outputInitialSyntax, context);

        assertionDetails->argumentMap.emplace(
            actualArg, std::make_tuple((const PropertyExprSyntax*)nullptr, context));
        connections.emplace_back(*body, *actualArg, outputInitialSyntax,
                                 std::span<const AttributeSymbol* const>{});
    }

    for (auto member : checkerSyntax->as<CheckerDeclarationSyntax>().members)
        body->addMembers(*member);

    auto instance = comp.emplace<CheckerInstanceSymbol>(checker.name, checker.location, *body);
    instance->setSyntax(*checkerSyntax);
    instance->connections = connections.copy(comp);
    return *instance;
}